

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  uint uVar1;
  secp256k1_scalar sec;
  secp256k1_scalar local_38;
  
  if (seckey == (uchar *)0x0) {
    (*(ctx->illegal_callback).fn)("seckey != NULL",(ctx->illegal_callback).data);
    uVar1 = 0;
  }
  else {
    uVar1 = secp256k1_scalar_set_b32_seckey(&local_38,seckey);
    secp256k1_scalar_cmov(&local_38,&secp256k1_scalar_zero,uVar1 ^ 1);
    secp256k1_scalar_negate(&local_38,&local_38);
    secp256k1_scalar_get_b32(seckey,&local_38);
  }
  return uVar1;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}